

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

obj * add_to_container(obj *container,obj *obj)

{
  int iVar1;
  obj *local_28;
  obj *otmp;
  obj *obj_local;
  obj *container_local;
  
  otmp = obj;
  obj_local = container;
  if (obj->where != '\0') {
    panic("add_to_container: obj not free (%d,%d,%d)",(ulong)(uint)(int)obj->where,
          (ulong)(uint)(int)obj->otyp,(ulong)(uint)(int)obj->invlet);
  }
  if ((container->where != '\x03') && (container->where != '\x04')) {
    obj_no_longer_held(obj);
  }
  local_28 = obj_local->cobj;
  while( true ) {
    if (local_28 == (obj *)0x0) {
      otmp->where = '\x02';
      (otmp->v).v_nexthere = obj_local;
      otmp->nobj = obj_local->cobj;
      obj_local->cobj = otmp;
      return otmp;
    }
    iVar1 = merged(&local_28,&otmp);
    if (iVar1 != 0) break;
    local_28 = local_28->nobj;
  }
  return local_28;
}

Assistant:

struct obj *add_to_container(struct obj *container, struct obj *obj)
{
    struct obj *otmp;

    if (obj->where != OBJ_FREE) {
	panic("add_to_container: obj not free (%d,%d,%d)",
	      obj->where, obj->otyp, obj->invlet);
    }

    if (container->where != OBJ_INVENT && container->where != OBJ_MINVENT)
	obj_no_longer_held(obj);

    /* merge if possible */
    for (otmp = container->cobj; otmp; otmp = otmp->nobj)
	if (merged(&otmp, &obj)) return otmp;

    obj->where = OBJ_CONTAINED;
    obj->ocontainer = container;
    obj->nobj = container->cobj;
    container->cobj = obj;
    return obj;
}